

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

tb_page_addr_t
get_page_addr_code_hostp_tricore
          (CPUArchState_conflict30 *env,target_ulong_conflict addr,void **hostp)

{
  _Bool _Var1;
  uint uVar2;
  tb_page_addr_t tVar3;
  ulong uVar4;
  uint uVar5;
  void *ptr;
  long lVar6;
  CPUTriCoreState *__mptr;
  uint page;
  
  uVar5 = *(uint *)(env[-1].irq + 3) >> 6 & addr >> 0xe;
  uVar4 = (ulong)(uVar5 << 6);
  lVar6 = (long)env[-1].irq[4] + uVar4;
  uVar2 = *(uint *)((long)env[-1].irq[4] + uVar4 + 8);
  page = addr & 0xffffc000;
  if ((uVar2 & 0xffffe000) != page) {
    _Var1 = victim_tlb_hit(env,0,(ulong)uVar5,8,page);
    if (_Var1) {
      uVar2 = *(uint *)(lVar6 + 8);
    }
    else {
      tlb_fill((CPUState *)&env[-0x32].cpu_model,addr,0,MMU_INST_FETCH,0,0);
      uVar4 = (ulong)((addr >> 0xe & *(uint *)(env[-1].irq + 3) >> 6) << 6);
      uVar2 = *(uint *)((long)env[-1].irq[4] + uVar4 + 8);
      if ((uVar2 >> 0xd & 1) != 0) {
        return 0xffffffffffffffff;
      }
      lVar6 = (long)env[-1].irq[4] + uVar4;
    }
    if ((uVar2 & 0xffffe000) != page) {
      __assert_fail("tlb_hit(uc, entry->addr_code, addr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                    ,0x463,
                    "tb_page_addr_t get_page_addr_code_hostp_tricore(CPUArchState *, target_ulong, void **)"
                   );
    }
  }
  if ((uVar2 >> 0xb & 1) == 0) {
    ptr = (void *)((ulong)addr + *(long *)(lVar6 + 0x10));
    if (hostp != (void **)0x0) {
      *hostp = ptr;
    }
    tVar3 = qemu_ram_addr_from_host_tricore(env->uc,ptr);
    if (tVar3 == 0xffffffffffffffff) {
      abort();
    }
  }
  else {
    tVar3 = 0xffffffffffffffff;
    if (hostp != (void **)0x0) {
      *hostp = (void *)0x0;
    }
  }
  return tVar3;
}

Assistant:

tb_page_addr_t get_page_addr_code_hostp(CPUArchState *env, target_ulong addr,
                                        void **hostp)
{
    struct uc_struct *uc = env->uc;
    uintptr_t mmu_idx = cpu_mmu_index(env, true);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    void *p;

    if (unlikely(!tlb_hit(uc, entry->addr_code, addr))) {
        if (!VICTIM_TLB_HIT(addr_code, addr)) {
            tlb_fill(env_cpu(env), addr, 0, MMU_INST_FETCH, mmu_idx, 0);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);

            if (unlikely(entry->addr_code & TLB_INVALID_MASK)) {
                /*
                 * The MMU protection covers a smaller range than a target
                 * page, so we must redo the MMU check for every insn.
                 */
                return -1;
            }
        }
        assert(tlb_hit(uc, entry->addr_code, addr));
    }

    if (unlikely(entry->addr_code & TLB_MMIO)) {
        /* The region is not backed by RAM.  */
        if (hostp) {
            *hostp = NULL;
        }
        return -1;
    }

    p = (void *)((uintptr_t)addr + entry->addend);
    if (hostp) {
        *hostp = p;
    }
    return qemu_ram_addr_from_host_nofail(env->uc, p);
}